

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::ContainsUntypedPointer(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  Op OVar2;
  int32_t iVar3;
  uint uVar4;
  Instruction *this_00;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_01;
  size_type sVar5;
  uint local_2c;
  uint32_t i;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    return false;
  }
  OVar2 = val::Instruction::opcode(this_00);
  iVar3 = spvOpcodeGeneratesType(OVar2);
  if (iVar3 == 0) {
    return false;
  }
  OVar2 = val::Instruction::opcode(this_00);
  if (OVar2 == OpTypeUntypedPointerKHR) {
    return true;
  }
  OVar2 = val::Instruction::opcode(this_00);
  if ((OVar2 - OpTypeVector < 3) || (OVar2 - OpTypeSampledImage < 3)) {
LAB_00bf8763:
    uVar4 = val::Instruction::GetOperandAs<unsigned_int>(this_00,1);
    this_local._7_1_ = ContainsUntypedPointer(this,uVar4);
  }
  else {
    if (OVar2 != OpTypeStruct) {
      if (OVar2 == OpTypePointer) {
        bVar1 = IsForwardPointer(this,id);
        if (!bVar1) {
          uVar4 = val::Instruction::GetOperandAs<unsigned_int>(this_00,2);
          bVar1 = ContainsUntypedPointer(this,uVar4);
          return bVar1;
        }
        return false;
      }
      if (OVar2 != OpTypeFunction) {
        if (OVar2 != OpTypeCooperativeMatrixNV) {
          return false;
        }
        goto LAB_00bf8763;
      }
    }
    local_2c = 1;
    while( true ) {
      this_01 = val::Instruction::operands(this_00);
      sVar5 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                        (this_01);
      if (sVar5 <= local_2c) break;
      uVar4 = val::Instruction::GetOperandAs<unsigned_int>(this_00,(ulong)local_2c);
      bVar1 = ContainsUntypedPointer(this,uVar4);
      if (bVar1) {
        return true;
      }
      local_2c = local_2c + 1;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::ContainsUntypedPointer(uint32_t id) const {
  const auto inst = FindDef(id);
  if (!inst) return false;
  if (!spvOpcodeGeneratesType(inst->opcode())) return false;
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(1u));
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(2u));
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct: {
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(i)))
          return true;
      }
      return false;
    }
    default:
      return false;
  }

  return false;
}